

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_decrypt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *deckey32,
              uchar *adaptor_sig162)

{
  uint uVar1;
  int iVar2;
  int ret;
  int high;
  int overflow;
  secp256k1_scalar sigr;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_scalar deckey;
  uchar *adaptor_sig162_local;
  uchar *deckey32_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (deckey32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"deckey32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig162 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_clear((secp256k1_scalar *)(s.d + 3));
    secp256k1_scalar_set_b32((secp256k1_scalar *)(sp.d + 3),deckey32,&ret);
    uVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)0x0,(secp256k1_scalar *)&high,(secp256k1_ge *)0x0,
                       (secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0
                       ,adaptor_sig162);
    iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)(sp.d + 3));
    ctx_local._4_4_ = (uint)((iVar2 != 0 ^ 0xffU) & 1) & uVar1 & ((ret != 0 ^ 0xffU) & 1);
    secp256k1_scalar_inverse((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)(sp.d + 3));
    secp256k1_scalar_mul
              ((secp256k1_scalar *)(sigr.d + 3),(secp256k1_scalar *)(sigr.d + 3),
               (secp256k1_scalar *)(s.d + 3));
    iVar2 = secp256k1_scalar_is_high((secp256k1_scalar *)(sigr.d + 3));
    secp256k1_scalar_cond_negate((secp256k1_scalar *)(sigr.d + 3),iVar2);
    secp256k1_ecdsa_signature_save(sig,(secp256k1_scalar *)&high,(secp256k1_scalar *)(sigr.d + 3));
    secp256k1_memczero(sig,0x40,(uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_clear((secp256k1_scalar *)(sp.d + 3));
    secp256k1_scalar_clear((secp256k1_scalar *)(s.d + 3));
    secp256k1_scalar_clear((secp256k1_scalar *)(sigr.d + 3));
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_decrypt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *deckey32, const unsigned char *adaptor_sig162) {
    secp256k1_scalar deckey;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    int high;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);

    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_set_b32(&deckey, deckey32, &overflow);
    ret &= !overflow;
    ret &= secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, NULL, &sp, NULL, NULL, adaptor_sig162);
    ret &= !secp256k1_scalar_is_zero(&deckey);
    secp256k1_scalar_inverse(&s, &deckey);
    /* s = s' * y⁻¹ */
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);
    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    secp256k1_memczero(&sig->data[0], 64, !ret);
    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}